

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_object_grow_and_rehash(JSON_Object *object)

{
  JSON_Value *value;
  uint uVar1;
  JSON_Status JVar2;
  size_t *psVar3;
  char **ppcVar4;
  JSON_Value **ppJVar5;
  size_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  JSON_Object *pJVar11;
  ulong uVar12;
  JSON_Value *pJVar13;
  byte bVar14;
  JSON_Object local_78;
  
  bVar14 = 0;
  uVar9 = object->cell_capacity * 2;
  uVar12 = 0x10;
  if (0x10 < uVar9) {
    uVar12 = uVar9;
  }
  local_78.count = 0;
  uVar9 = (uVar12 * 7) / 10 & 0xffffffff;
  local_78.item_capacity = uVar9;
  local_78.cell_capacity = uVar12;
  psVar3 = (size_t *)(*parson_malloc)(uVar12 * 8);
  sVar10 = uVar9 << 3;
  local_78.cells = psVar3;
  ppcVar4 = (char **)(*parson_malloc)(sVar10);
  local_78.names = ppcVar4;
  ppJVar5 = (JSON_Value **)(*parson_malloc)(sVar10);
  local_78.values = ppJVar5;
  psVar6 = (size_t *)(*parson_malloc)(sVar10);
  local_78.cell_ixs = psVar6;
  puVar7 = (unsigned_long *)(*parson_malloc)(sVar10);
  local_78.hashes = puVar7;
  if ((((psVar3 == (size_t *)0x0) || (ppcVar4 == (char **)0x0)) || (ppJVar5 == (JSON_Value **)0x0))
     || (puVar7 == (unsigned_long *)0x0 || psVar6 == (size_t *)0x0)) {
    (*parson_free)(psVar3);
    (*parson_free)(ppcVar4);
    (*parson_free)(ppJVar5);
    (*parson_free)(psVar6);
    (*parson_free)(puVar7);
LAB_0016ec2a:
    JVar2 = -1;
  }
  else {
    for (uVar1 = 0; uVar1 < uVar12; uVar1 = uVar1 + 1) {
      psVar3[uVar1] = 0xffffffffffffffff;
    }
    uVar1 = 0;
    if (object == (JSON_Object *)0x0) {
      pJVar13 = (JSON_Value *)0x0;
    }
    else {
      pJVar13 = object->wrapping_value;
    }
    local_78.wrapping_value = pJVar13;
    for (; uVar9 = (ulong)uVar1, uVar9 < object->count; uVar1 = uVar1 + 1) {
      value = object->values[uVar9];
      JVar2 = json_object_add(&local_78,object->names[uVar9],value);
      if (JVar2 != 0) {
        json_object_deinit(&local_78,0,0);
        goto LAB_0016ec2a;
      }
      value->parent = pJVar13;
    }
    JVar2 = 0;
    json_object_deinit(object,0,0);
    pJVar11 = &local_78;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      object->wrapping_value = pJVar11->wrapping_value;
      pJVar11 = (JSON_Object *)((long)pJVar11 + ((ulong)bVar14 * -2 + 1) * 8);
      object = (JSON_Object *)((long)object + (ulong)bVar14 * -0x10 + 8);
    }
  }
  return JVar2;
}

Assistant:

static JSON_Status json_object_grow_and_rehash(JSON_Object *object) {
    JSON_Value *wrapping_value = NULL;
    JSON_Object new_object;
    char *key = NULL;
    JSON_Value *value = NULL;
    unsigned int i = 0;
    size_t new_capacity = MAX(object->cell_capacity * 2, STARTING_CAPACITY);
    JSON_Status res = json_object_init(&new_object, new_capacity);
    if (res != JSONSuccess) {
        return JSONFailure;
    }

    wrapping_value = json_object_get_wrapping_value(object);
    new_object.wrapping_value = wrapping_value;

    for (i = 0; i < object->count; i++) {
        key = object->names[i];
        value = object->values[i];
        res = json_object_add(&new_object, key, value);
        if (res != JSONSuccess) {
            json_object_deinit(&new_object, PARSON_FALSE, PARSON_FALSE);
            return JSONFailure;
        }
        value->parent = wrapping_value;
    }
    json_object_deinit(object, PARSON_FALSE, PARSON_FALSE);
    *object = new_object;
    return JSONSuccess;
}